

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O3

void __thiscall Fl_Widget::~Fl_Widget(Fl_Widget *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  this->_vptr_Fl_Widget = (_func_int **)&PTR__Fl_Widget_00279f70;
  Fl::clear_widget_pointer(this);
  uVar3 = this->flags_;
  if ((uVar3 >> 10 & 1) != 0) {
    free((this->label_).value);
    uVar3 = this->flags_;
  }
  if ((uVar3 >> 0x11 & 1) != 0) {
    free(this->tooltip_);
  }
  if (this->parent_ != (Fl_Group *)0x0) {
    Fl_Group::remove(this->parent_,(char *)this);
  }
  this->parent_ = (Fl_Group *)0x0;
  fl_throw_focus(this);
  iVar2 = obj_head;
  if (this->callback_ == default_callback) {
    if (obj_tail != obj_head) {
      obj_head = obj_tail;
      iVar4 = obj_tail;
      iVar5 = obj_tail;
      do {
        lVar6 = (long)iVar5;
        bVar1 = 0x12 < iVar5;
        iVar5 = iVar5 + 1;
        if (bVar1) {
          iVar5 = 0;
        }
        if (obj_queue[lVar6] != this) {
          obj_head = iVar4 + 1;
          obj_queue[iVar4] = obj_queue[lVar6];
          bVar1 = 0x12 < iVar4;
          iVar4 = iVar4 + 1;
          if (bVar1) {
            obj_head = 0;
            iVar4 = 0;
          }
        }
      } while (iVar5 != iVar2);
    }
  }
  return;
}

Assistant:

Fl_Widget::~Fl_Widget() {
  Fl::clear_widget_pointer(this);
  if (flags() & COPIED_LABEL) free((void *)(label_.value));
  if (flags() & COPIED_TOOLTIP) free((void *)(tooltip_));
  // remove from parent group
  if (parent_) parent_->remove(this);
#ifdef DEBUG_DELETE
  if (parent_) { // this should never happen
    printf("*** Fl_Widget: parent_->remove(this) failed [%p,%p]\n",parent_,this);
  }
#endif // DEBUG_DELETE
  parent_ = 0; // Don't throw focus to a parent widget.
  fl_throw_focus(this);
  // remove stale entries from default callback queue (Fl::readqueue())
  if (callback_ == default_callback) cleanup_readqueue(this);
}